

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::hash(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
             vector<int,_std::allocator<int>_> *su)

{
  pointer piVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int local_4c;
  Arcflow *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = this;
  local_40 = su;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)hash::last_size);
  iVar5 = 0;
  puVar2 = (uint *)0x0;
  for (local_38 = 0;
      piVar1 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      local_38 <
      (int)((ulong)((long)(local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      local_38 = local_38 + 1) {
    uVar8 = piVar1[local_38];
    for (iVar7 = (local_48->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_38]; iVar7 != 0; iVar7 = iVar7 - iVar4) {
      if (iVar5 == 0) {
        local_4c = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_4c);
        puVar2 = (uint *)((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                          _M_impl.super__Vector_impl_data._M_finish + -1);
        iVar5 = 0x20;
      }
      iVar4 = iVar7;
      if (iVar5 < iVar7) {
        iVar4 = iVar5;
      }
      bVar3 = (byte)iVar4;
      uVar6 = ~(-1 << (bVar3 & 0x1f)) & uVar8;
      uVar8 = (int)uVar8 >> (bVar3 & 0x1f);
      *puVar2 = uVar6 | *puVar2 << (bVar3 & 0x1f);
      iVar5 = iVar5 - iVar4;
    }
  }
  hash::last_size =
       (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> Arcflow::hash(const std::vector<int> &su) {
	static int last_size = 1;
	std::vector<int> h;
	h.reserve(last_size);
	int *p = NULL, dst_bits = 0;
	for (int i = 0; i < static_cast<int>(su.size()); i++) {
		int x = su[i];
		int src_bits = hash_bits[i];
		while (src_bits != 0) {
			if (dst_bits == 0) {
				h.push_back(0);
				p = &h.back();
				dst_bits = sizeof(int) * 8;
			}
			int window_width = std::min(src_bits, dst_bits);
			*p <<= window_width;
			*p |= x & ((1u << window_width) - 1);
			x >>= window_width;
			src_bits -= window_width;
			dst_bits -= window_width;
		}
	}
	last_size = h.size();
	return h;
}